

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

xmlXPathFunction libxml_xmlXPathFuncLookupFunc(void *ctxt,xmlChar *name,xmlChar *ns_uri)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  lVar2 = 0;
  while( true ) {
    if (libxml_xpathCallbacksNb <= lVar2) {
      return (xmlXPathFunction)0x0;
    }
    if (((*(void **)(libxml_xpathCallbacks + lVar3) == ctxt) &&
        (iVar1 = xmlStrEqual(name,*(undefined8 *)(libxml_xpathCallbacks + lVar3 + 8)), iVar1 != 0))
       && (iVar1 = xmlStrEqual(ns_uri,*(undefined8 *)(libxml_xpathCallbacks + lVar3 + 0x10)),
          iVar1 != 0)) break;
    lVar2 = lVar2 + 1;
    lVar3 = lVar3 + 0x20;
  }
  return libxml_xmlXPathFuncCallback;
}

Assistant:

static xmlXPathFunction
libxml_xmlXPathFuncLookupFunc(void *ctxt, const xmlChar * name,
                              const xmlChar * ns_uri)
{
    int i;

    /*
     * This is called once only. The address is then stored in the
     * XPath expression evaluation, the proper object to call can
     * then still be found using the execution context function
     * and functionURI fields.
     */
    for (i = 0; i < libxml_xpathCallbacksNb; i++) {
			if ((ctxt == (*libxml_xpathCallbacks)[i].ctx) &&
					(xmlStrEqual(name, (*libxml_xpathCallbacks)[i].name)) &&
					(xmlStrEqual(ns_uri, (*libxml_xpathCallbacks)[i].ns_uri))) {
            return (libxml_xmlXPathFuncCallback);
        }
    }
    return (NULL);
}